

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

unsigned_long
rcg::anon_unknown_6::getBufferValue<unsigned_long>
          (shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,void *buffer,BUFFER_INFO_CMD cmd)

{
  GC_ERROR GVar1;
  unsigned_long ret;
  size_t size;
  INFO_DATATYPE type;
  unsigned_long local_18 [2];
  INFO_DATATYPE local_4;
  
  local_18[0] = 0;
  local_18[1] = 8;
  if ((buffer == (void *)0x0 || stream == (void *)0x0) ||
     (GVar1 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->DSGetBufferInfo)(stream,buffer,cmd,&local_4,local_18,local_18 + 1),
     GVar1 != 0)) {
    local_18[0] = 0;
  }
  return local_18[0];
}

Assistant:

inline T getBufferValue(const std::shared_ptr<const GenTLWrapper> &gentl,
                                          void *stream, void *buffer, GenTL::BUFFER_INFO_CMD cmd)
{
  T ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(T);

  if (stream != 0 && buffer != 0)
  {
    if (gentl->DSGetBufferInfo(stream, buffer, cmd, &type, &ret, &size) != GenTL::GC_ERR_SUCCESS)
    {
      ret=0;
    }
  }

  return ret;
}